

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O0

set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *
dg::pta::getReachableNodes(PSNode *n,PSNode *exit,bool interproc)

{
  bool bVar1;
  reference ppPVar2;
  PSNodeRet *this;
  reference ppPVar3;
  byte in_CL;
  PSNode *in_RDX;
  PSNode *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::pta::PSNode_*>,_bool> pVar4;
  PSNode *ret;
  const_iterator __end6;
  const_iterator __begin6;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *__range6;
  PSNodeRet *R;
  PointerSubgraph *subg;
  const_iterator __end5;
  const_iterator __begin5;
  vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_> *__range5;
  PSNodeCall *C;
  PSNode *succ;
  const_iterator __end3;
  const_iterator __begin3;
  NodesVec *__range3;
  PSNode *cur;
  QueueFIFO<dg::pta::PSNode_*> fifo;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *cont;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> *in_stack_fffffffffffffed8;
  const_iterator in_stack_fffffffffffffef8;
  const_iterator in_stack_ffffffffffffff00;
  __normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
  local_d8;
  vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_> *local_d0;
  PSNodeCall *local_c8;
  PSNode *local_c0;
  PSNode **local_b8;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  local_b0;
  NodesVec *local_a8;
  _Base_ptr local_a0;
  byte local_98;
  _Base_ptr local_90;
  byte local_88;
  PSNode *local_80;
  undefined1 local_71;
  byte local_19;
  PSNode *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  ADT::QueueFIFO<dg::pta::PSNode_*>::QueueFIFO((QueueFIFO<dg::pta::PSNode_*> *)0x198394);
  local_71 = 0;
  std::set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>::set
            ((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
              *)0x1983a6);
  ADT::QueueFIFO<dg::pta::PSNode_*>::push
            ((QueueFIFO<dg::pta::PSNode_*> *)in_RDI,(PSNode **)in_stack_fffffffffffffed8);
  while (bVar1 = ADT::QueueFIFO<dg::pta::PSNode_*>::empty((QueueFIFO<dg::pta::PSNode_*> *)0x1983c8),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_80 = ADT::QueueFIFO<dg::pta::PSNode_*>::pop((QueueFIFO<dg::pta::PSNode_*> *)in_RDI);
    pVar4 = std::
            set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
            ::insert((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                      *)in_stack_ffffffffffffff00._M_current,in_stack_fffffffffffffef8._M_current);
    local_a0 = (_Base_ptr)pVar4.first._M_node;
    local_98 = pVar4.second;
    local_90 = local_a0;
    local_88 = local_98;
    if (((local_98 ^ 0xff) & 1) == 0) {
      local_a8 = SubgraphNode<dg::pta::PSNode>::successors
                           (&local_80->super_SubgraphNode<dg::pta::PSNode>);
      local_b0._M_current =
           (PSNode **)
           std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                     (in_stack_fffffffffffffed8);
      local_b8 = (PSNode **)
                 std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                           (in_stack_fffffffffffffed8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_RDI,
                                (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                 *)in_stack_fffffffffffffed8), bVar1) {
        ppPVar3 = __gnu_cxx::
                  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                  ::operator*(&local_b0);
        local_c0 = *ppPVar3;
        if (local_c0 != local_18) {
          ADT::QueueFIFO<dg::pta::PSNode_*>::push
                    ((QueueFIFO<dg::pta::PSNode_*> *)in_RDI,(PSNode **)in_stack_fffffffffffffed8);
        }
        __gnu_cxx::
        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
        ::operator++(&local_b0);
      }
      if ((local_19 & 1) != 0) {
        local_c8 = PSNodeCall::get(in_RDI);
        if (local_c8 == (PSNodeCall *)0x0) {
          this = PSNodeRet::get(in_RDI);
          if (this != (PSNodeRet *)0x0) {
            PSNodeRet::getReturnSites(this);
            in_stack_ffffffffffffff00 =
                 std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::begin
                           (in_stack_fffffffffffffed8);
            in_stack_fffffffffffffef8 =
                 std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::end
                           (in_stack_fffffffffffffed8);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                       *)in_RDI,
                                      (__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                       *)in_stack_fffffffffffffed8), bVar1) {
              ppPVar3 = __gnu_cxx::
                        __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                        ::operator*((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                                     *)&stack0xffffffffffffff00);
              if (*ppPVar3 != local_18) {
                ADT::QueueFIFO<dg::pta::PSNode_*>::push
                          ((QueueFIFO<dg::pta::PSNode_*> *)in_RDI,
                           (PSNode **)in_stack_fffffffffffffed8);
              }
              __gnu_cxx::
              __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
              ::operator++((__normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
                            *)&stack0xffffffffffffff00);
            }
          }
        }
        else {
          local_d0 = PSNodeCall::getCallees(local_c8);
          local_d8._M_current =
               (PointerSubgraph **)
               std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>
               ::begin((vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>
                        *)in_stack_fffffffffffffed8);
          std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>::end
                    ((vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>
                      *)in_stack_fffffffffffffed8);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
                                     *)in_RDI,
                                    (__normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
                                     *)in_stack_fffffffffffffed8), bVar1) {
            ppPVar2 = __gnu_cxx::
                      __normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
                      ::operator*(&local_d8);
            if ((*ppPVar2)->root != local_18) {
              ADT::QueueFIFO<dg::pta::PSNode_*>::push
                        ((QueueFIFO<dg::pta::PSNode_*> *)in_RDI,(PSNode **)in_stack_fffffffffffffed8
                        );
            }
            __gnu_cxx::
            __normal_iterator<dg::pta::PointerSubgraph_*const_*,_std::vector<dg::pta::PointerSubgraph_*,_std::allocator<dg::pta::PointerSubgraph_*>_>_>
            ::operator++(&local_d8);
          }
        }
      }
    }
  }
  local_71 = 1;
  ADT::QueueFIFO<dg::pta::PSNode_*>::~QueueFIFO((QueueFIFO<dg::pta::PSNode_*> *)0x19865c);
  return (set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_> *
         )in_RDI;
}

Assistant:

inline std::set<PSNode *> getReachableNodes(PSNode *n, PSNode *exit = nullptr,
                                            bool interproc = true) {
    ADT::QueueFIFO<PSNode *> fifo;
    std::set<PSNode *> cont;

    assert(n && "No starting node given.");
    fifo.push(n);

    while (!fifo.empty()) {
        PSNode *cur = fifo.pop();
        if (!cont.insert(cur).second)
            continue; // we already visited this node

        for (PSNode *succ : cur->successors()) {
            assert(succ != nullptr);

            if (succ == exit)
                continue;

            fifo.push(succ);
        }

        if (interproc) {
            if (PSNodeCall *C = PSNodeCall::get(cur)) {
                for (auto *subg : C->getCallees()) {
                    if (subg->root == exit)
                        continue;
                    fifo.push(subg->root);
                }
            } else if (PSNodeRet *R = PSNodeRet::get(cur)) {
                for (auto *ret : R->getReturnSites()) {
                    if (ret == exit)
                        continue;
                    fifo.push(ret);
                }
            }
        }
    }

    return cont;
}